

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::printAvailableUniforms(Uniforms *this,bool _non_active)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Self local_68;
  _Self local_60;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20;
  iterator it;
  bool _non_active_local;
  Uniforms *this_local;
  
  it._M_node._7_1_ = _non_active;
  if (_non_active) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
         ::begin(&this->functions);
    while( true ) {
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::end(&this->functions);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"uniform ");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_20);
      poVar2 = std::operator<<(poVar2,(string *)&(ppVar3->second).type);
      poVar2 = std::operator<<(poVar2,' ');
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_20);
      poVar2 = std::operator<<(poVar2,(string *)ppVar3);
      std::operator<<(poVar2,";");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_20);
      bVar1 = std::function::operator_cast_to_bool((function *)&(ppVar3->second).print);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout," // ");
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_20);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        ::operator()(&local_48,&(ppVar3->second).print);
        std::operator<<(poVar2,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
      ::operator++(&local_20);
    }
  }
  else {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
         ::begin(&this->functions);
    while( true ) {
      local_68._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::end(&this->functions);
      bVar1 = std::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_60);
      if (((ppVar3->second).present & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"uniform ");
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_60);
        poVar2 = std::operator<<(poVar2,(string *)&(ppVar3->second).type);
        poVar2 = std::operator<<(poVar2,' ');
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_60);
        poVar2 = std::operator<<(poVar2,(string *)ppVar3);
        std::operator<<(poVar2,";");
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_60);
        bVar1 = std::function::operator_cast_to_bool((function *)&(ppVar3->second).print);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cout," // ");
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                   ::operator->(&local_60);
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          ::operator()(&local_88,&(ppVar3->second).print);
          std::operator<<(poVar2,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
      ::operator++(&local_60);
    }
  }
  return;
}

Assistant:

void Uniforms::printAvailableUniforms(bool _non_active) {
    if (_non_active) {
        // Print all Native Uniforms (they carry functions)
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            std::cout << "uniform " << it->second.type << ' ' << it->first << ";";
            if (it->second.print) 
                std::cout << " // " << it->second.print();
            std::cout << std::endl;
        }
    }
    else {
        // Print Native Uniforms (they carry functions) that are present on the shader
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            if (it->second.present) {
                std::cout<< "uniform " << it->second.type << ' ' << it->first << ";";
                if (it->second.print)
                    std::cout << " // " << it->second.print();
                std::cout << std::endl;
            }
        }
    }
}